

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O0

int PMX(int maxvar)

{
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  int local_44;
  int local_40;
  int local_3c;
  int v;
  int u;
  int i;
  int *inv2;
  int *inv1;
  int dad;
  int mom;
  int cut2;
  int cut1;
  int maxvar_local;
  
  cut2 = maxvar;
  __ptr = malloc((long)maxvar << 2);
  if (__ptr == (void *)0x0) {
    cut1 = 0;
  }
  else {
    __ptr_00 = malloc((long)cut2 << 2);
    if (__ptr_00 == (void *)0x0) {
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      cut1 = 0;
    }
    else {
      iVar1 = roulette((int *)((long)&inv1 + 4),(int *)&inv1);
      if (iVar1 == 0) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
        }
        cut1 = 0;
      }
      else {
        mom = rand_int(numvars + -1);
        do {
          dad = rand_int(numvars + -1);
        } while (mom == dad);
        for (v = 0; v < cut2; v = v + 1) {
          *(undefined4 *)((long)__ptr + (long)v * 4) = 0xffffffff;
          *(undefined4 *)((long)__ptr_00 + (long)v * 4) = 0xffffffff;
        }
        v = mom;
        while (iVar1 = dad, v != dad) {
          storedd[popsize * (numvars + 1) + v] = storedd[(int)inv1 * (numvars + 1) + v];
          *(int *)((long)__ptr + (long)storedd[popsize * (numvars + 1) + v] * 4) = v;
          storedd[(popsize + 1) * (numvars + 1) + v] = storedd[inv1._4_4_ * (numvars + 1) + v];
          *(int *)((long)__ptr_00 + (long)storedd[(popsize + 1) * (numvars + 1) + v] * 4) = v;
          if (v == numvars + -1) {
            local_40 = 0;
          }
          else {
            local_40 = v + 1;
          }
          v = local_40;
        }
        while (v = iVar1, v != mom) {
          local_3c = v;
          do {
            iVar1 = storedd[inv1._4_4_ * (numvars + 1) + local_3c];
            local_3c = *(int *)((long)__ptr + (long)iVar1 * 4);
          } while (local_3c != -1);
          storedd[popsize * (numvars + 1) + v] = iVar1;
          *(int *)((long)__ptr + (long)iVar1 * 4) = v;
          local_3c = v;
          do {
            iVar1 = storedd[(int)inv1 * (numvars + 1) + local_3c];
            local_3c = *(int *)((long)__ptr_00 + (long)iVar1 * 4);
          } while (local_3c != -1);
          storedd[(popsize + 1) * (numvars + 1) + v] = iVar1;
          *(int *)((long)__ptr_00 + (long)iVar1 * 4) = v;
          if (v == numvars + -1) {
            local_44 = 0;
          }
          else {
            local_44 = v + 1;
          }
          v = local_44;
          iVar1 = v;
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
        }
        cut1 = 1;
      }
    }
  }
  return cut1;
}

Assistant:

static int
PMX(
  int  maxvar)
{
    int         cut1,cut2;      /* the two cut positions (random) */
    int         mom,dad;        /* the two randomly chosen parents */
    int         *inv1;          /* inverse permutations for repair algo */
    int         *inv2;
    int         i;              /* loop vars */
    int         u,v;            /* aux vars */

    inv1 = ABC_ALLOC(int,maxvar);
    if (inv1 == NULL) {
        return(0);
    }
    inv2 = ABC_ALLOC(int,maxvar);
    if (inv2 == NULL) {
        ABC_FREE(inv1);
        return(0);
    }

    /* Choose two orders from the population using roulette wheel. */
    if (!roulette(&mom,&dad)) {
        ABC_FREE(inv1);
        ABC_FREE(inv2);
        return(0);
    }

    /* Choose two random cut positions. A cut in position i means that
    ** the cut immediately precedes position i.  If cut1 < cut2, we
    ** exchange the middle of the two orderings; otherwise, we
    ** exchange the beginnings and the ends.
    */
    cut1 = rand_int(numvars-1);
    do {
        cut2 = rand_int(numvars-1);
    } while (cut1 == cut2);

#if 0
    /* Print out the parents. */
    (void) fprintf(table->out,
                   "Crossover of %d (mom) and %d (dad) between %d and %d\n",
                   mom,dad,cut1,cut2);
    for (i = 0; i < numvars; i++) {
        if (i == cut1 || i == cut2) (void) fprintf(table->out,"|");
        (void) fprintf(table->out,"%2d ",STOREDD(mom,i));
    }
    (void) fprintf(table->out,"\n");
    for (i = 0; i < numvars; i++) {
        if (i == cut1 || i == cut2) (void) fprintf(table->out,"|");
        (void) fprintf(table->out,"%2d ",STOREDD(dad,i));
    }
    (void) fprintf(table->out,"\n");
#endif

    /* Initialize the inverse permutations: -1 means yet undetermined. */
    for (i = 0; i < maxvar; i++) {
        inv1[i] = -1;
        inv2[i] = -1;
    }

    /* Copy the portions whithin the cuts. */
    for (i = cut1; i != cut2; i = (i == numvars-1) ? 0 : i+1) {
        STOREDD(popsize,i) = STOREDD(dad,i);
        inv1[STOREDD(popsize,i)] = i;
        STOREDD(popsize+1,i) = STOREDD(mom,i);
        inv2[STOREDD(popsize+1,i)] = i;
    }

    /* Now apply the repair algorithm outside the cuts. */
    for (i = cut2; i != cut1; i = (i == numvars-1 ) ? 0 : i+1) {
        v = i;
        do {
            u = STOREDD(mom,v);
            v = inv1[u];
        } while (v != -1);
        STOREDD(popsize,i) = u;
        inv1[u] = i;
        v = i;
        do {
            u = STOREDD(dad,v);
            v = inv2[u];
        } while (v != -1);
        STOREDD(popsize+1,i) = u;
        inv2[u] = i;
    }

#if 0
    /* Print the results of crossover. */
    for (i = 0; i < numvars; i++) {
        if (i == cut1 || i == cut2) (void) fprintf(table->out,"|");
        (void) fprintf(table->out,"%2d ",STOREDD(popsize,i));
    }
    (void) fprintf(table->out,"\n");
    for (i = 0; i < numvars; i++) {
        if (i == cut1 || i == cut2) (void) fprintf(table->out,"|");
        (void) fprintf(table->out,"%2d ",STOREDD(popsize+1,i));
    }
    (void) fprintf(table->out,"\n");
#endif

    ABC_FREE(inv1);
    ABC_FREE(inv2);
    return(1);

}